

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Lofinator.cpp
# Opt level: O0

int Lofinator::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  EffectData *pEVar1;
  float fVar2;
  float fVar3;
  int local_4c;
  uint local_48;
  int i;
  uint n;
  float decrate;
  float quant2;
  float quant1;
  Data *data;
  int outchannels_local;
  int inchannels_local;
  uint length_local;
  float *outbuffer_local;
  float *inbuffer_local;
  UnityAudioEffectState *state_local;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<Lofinator::EffectData>(state);
  fVar2 = powf(2.0,(pEVar1->field_0).data.p[1]);
  fVar3 = (float)(state->field_0).field_0.samplerate / (pEVar1->field_0).data.p[0];
  for (local_48 = 0; local_48 < length; local_48 = local_48 + 1) {
    for (local_4c = 0; local_4c < outchannels; local_4c = local_4c + 1) {
      *(float *)((long)&pEVar1->field_0 + (long)local_4c * 4 + 0x28) =
           *(float *)((long)&pEVar1->field_0 + (long)local_4c * 4 + 0x28) + 1.0;
      if (fVar3 <= *(float *)((long)&pEVar1->field_0 + (long)local_4c * 4 + 0x28)) {
        *(float *)((long)&pEVar1->field_0 + (long)local_4c * 4 + 0x28) =
             *(float *)((long)&pEVar1->field_0 + (long)local_4c * 4 + 0x28) - fVar3;
        *(float *)((long)&pEVar1->field_0 + (long)local_4c * 4 + 8) =
             inbuffer[local_48 * outchannels + local_4c];
      }
      outbuffer[local_48 * outchannels + local_4c] =
           (float)(int)(*(float *)((long)&pEVar1->field_0 + (long)local_4c * 4 + 8) * fVar2) *
           (1.0 / fVar2);
    }
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;

        float quant1 = powf(2.0f, data->p[P_QUANT]);
        float quant2 = 1.0f / quant1;
        float decrate = (float)state->samplerate / data->p[P_DECRATE];
        for (unsigned int n = 0; n < length; n++)
        {
            for (int i = 0; i < outchannels; i++)
            {
                data->sampleholdcount[i] += 1.0f;
                if (data->sampleholdcount[i] >= decrate)
                {
                    data->sampleholdcount[i] -= decrate;
                    data->samplehold[i] = inbuffer[n * outchannels + i];
                }
                outbuffer[n * outchannels + i] = (signed int)(data->samplehold[i] * quant1) * quant2;
            }
        }

        return UNITY_AUDIODSP_OK;
    }